

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

bool __thiscall
FNodeBuilder::CheckSubsectorOverlappingSegs
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg)

{
  FPrivSeg *pFVar1;
  FPrivSeg *pFVar2;
  bool bVar3;
  uint mate;
  uint uVar4;
  uint seg;
  
  if (set != 0xffffffff) {
    pFVar2 = (this->Segs).Array;
    mate = set;
    do {
      pFVar1 = pFVar2 + mate;
      if ((pFVar1->linedef != -1) && (uVar4 = pFVar2[mate].next, uVar4 != 0xffffffff)) {
        do {
          if ((pFVar2[uVar4].v1 == pFVar1->v1) && (pFVar2[uVar4].v2 == pFVar1->v2)) {
            seg = uVar4;
            if (pFVar2[uVar4].linedef == -1) {
              seg = mate;
              mate = uVar4;
            }
            *splitseg = 0xffffffff;
            bVar3 = ShoveSegBehind(this,set,node,seg,mate);
            return bVar3;
          }
          uVar4 = pFVar2[uVar4].next;
        } while (uVar4 != 0xffffffff);
      }
      mate = pFVar1->next;
    } while (mate != 0xffffffff);
  }
  return false;
}

Assistant:

bool FNodeBuilder::CheckSubsectorOverlappingSegs (DWORD set, node_t &node, DWORD &splitseg)
{
	int v1, v2;
	DWORD seg1, seg2;

	for (seg1 = set; seg1 != DWORD_MAX; seg1 = Segs[seg1].next)
	{
		if (Segs[seg1].linedef == -1)
		{ // Do not check minisegs.
			continue;
		}
		v1 = Segs[seg1].v1;
		v2 = Segs[seg1].v2;
		for (seg2 = Segs[seg1].next; seg2 != DWORD_MAX; seg2 = Segs[seg2].next)
		{
			if (Segs[seg2].v1 == v1 && Segs[seg2].v2 == v2)
			{
				if (Segs[seg2].linedef == -1)
				{ // Do not put minisegs into a new subsector.
					swapvalues (seg1, seg2);
				}
				D(Printf(PRINT_LOG, "Need to synthesize a splitter for set %d on seg %d (ov)\n", set, seg2));
				splitseg = DWORD_MAX;

				return ShoveSegBehind (set, node, seg2, seg1);
			}
		}
	}
	// It really is a good subsector.
	return false;
}